

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void Rml::Parse::Expression(DataParser *parser)

{
  undefined4 *puVar1;
  Variant *pVVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  pointer pIVar8;
  pointer pIVar9;
  pointer pIVar10;
  char cVar11;
  undefined8 *puVar12;
  bool *in_RCX;
  bool bVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  String name;
  size_type __dnew;
  bool valid_function_name;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [2];
  undefined1 local_80 [40];
  char local_58;
  
  Relational(parser);
  bVar13 = true;
  do {
    if (parser->reached_end == false) {
      in_RCX = (bool *)parser->index;
      cVar11 = in_RCX[(long)(parser->expression)._M_dataplus._M_p];
    }
    else {
      cVar11 = '\0';
    }
    if (cVar11 == '|') {
      DataParser::Match(parser,'|',false);
      if ((parser->reached_end != false) ||
         (in_RCX = (bool *)parser->index,
         in_RCX[(long)(parser->expression)._M_dataplus._M_p] != true)) {
        DataParser::Push(parser);
        DataParser::SkipWhitespace(parser);
        local_58 = '\x01';
        VariableOrFunctionName_abi_cxx11_
                  ((String *)local_b0,(Parse *)parser,(DataParser *)&stack0xffffffffffffffa8,in_RCX)
        ;
        if (local_b0._8_8_ == 0) {
          local_80._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x39;
          local_e0._0_8_ = local_d0;
          local_e0._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_e0,(ulong)local_80);
          local_d0[0]._M_allocated_capacity = local_80._0_8_;
          *(char *)(local_e0._0_8_ + 0x29) = 't';
          *(char *)(local_e0._0_8_ + 0x2a) = ' ';
          *(char *)(local_e0._0_8_ + 0x2b) = 'a';
          *(char *)(local_e0._0_8_ + 0x2c) = 'n';
          *(char *)(local_e0._0_8_ + 0x2d) = ' ';
          *(char *)(local_e0._0_8_ + 0x2e) = 'e';
          *(char *)(local_e0._0_8_ + 0x2f) = 'm';
          *(char *)(local_e0._0_8_ + 0x30) = 'p';
          *(char *)(local_e0._0_8_ + 0x31) = 't';
          *(char *)(local_e0._0_8_ + 0x32) = 'y';
          *(char *)(local_e0._0_8_ + 0x33) = ' ';
          *(char *)(local_e0._0_8_ + 0x34) = 'n';
          *(char *)(local_e0._0_8_ + 0x35) = 'a';
          *(char *)(local_e0._0_8_ + 0x36) = 'm';
          *(char *)(local_e0._0_8_ + 0x37) = 'e';
          *(char *)(local_e0._0_8_ + 0x38) = '.';
          *(char *)(local_e0._0_8_ + 0x20) = 'm';
          *(char *)(local_e0._0_8_ + 0x21) = 'e';
          *(char *)(local_e0._0_8_ + 0x22) = ' ';
          *(char *)(local_e0._0_8_ + 0x23) = 'b';
          *(char *)(local_e0._0_8_ + 0x24) = 'u';
          *(char *)(local_e0._0_8_ + 0x25) = 't';
          *(char *)(local_e0._0_8_ + 0x26) = ' ';
          *(char *)(local_e0._0_8_ + 0x27) = 'g';
          *(char *)(local_e0._0_8_ + 0x28) = 'o';
          *(char *)(local_e0._0_8_ + 0x29) = 't';
          *(char *)(local_e0._0_8_ + 0x2a) = ' ';
          *(char *)(local_e0._0_8_ + 0x2b) = 'a';
          *(char *)(local_e0._0_8_ + 0x2c) = 'n';
          *(char *)(local_e0._0_8_ + 0x2d) = ' ';
          *(char *)(local_e0._0_8_ + 0x2e) = 'e';
          *(char *)(local_e0._0_8_ + 0x2f) = 'm';
          *(char *)(local_e0._0_8_ + 0x10) = 'f';
          *(char *)(local_e0._0_8_ + 0x11) = 'o';
          *(char *)(local_e0._0_8_ + 0x12) = 'r';
          *(char *)(local_e0._0_8_ + 0x13) = 'm';
          *(char *)(local_e0._0_8_ + 0x14) = ' ';
          *(char *)(local_e0._0_8_ + 0x15) = 'f';
          *(char *)(local_e0._0_8_ + 0x16) = 'u';
          *(char *)(local_e0._0_8_ + 0x17) = 'n';
          *(char *)(local_e0._0_8_ + 0x18) = 'c';
          *(char *)(local_e0._0_8_ + 0x19) = 't';
          *(char *)(local_e0._0_8_ + 0x1a) = 'i';
          *(char *)(local_e0._0_8_ + 0x1b) = 'o';
          *(char *)(local_e0._0_8_ + 0x1c) = 'n';
          *(char *)(local_e0._0_8_ + 0x1d) = ' ';
          *(char *)(local_e0._0_8_ + 0x1e) = 'n';
          *(char *)(local_e0._0_8_ + 0x1f) = 'a';
          *(undefined8 *)local_e0._0_8_ = 0x6465746365707845;
          *(char *)(local_e0._0_8_ + 8) = ' ';
          *(char *)(local_e0._0_8_ + 9) = 'a';
          *(char *)(local_e0._0_8_ + 10) = ' ';
          *(char *)(local_e0._0_8_ + 0xb) = 't';
          *(char *)(local_e0._0_8_ + 0xc) = 'r';
          *(char *)(local_e0._0_8_ + 0xd) = 'a';
          *(char *)(local_e0._0_8_ + 0xe) = 'n';
          *(char *)(local_e0._0_8_ + 0xf) = 's';
          local_e0._8_8_ = local_80._0_8_;
          *(char *)(local_e0._0_8_ + local_80._0_8_) = '\0';
          DataParser::Error(parser,(String *)local_e0);
          local_80._16_8_ = local_d0[0]._M_allocated_capacity;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._0_8_ == local_d0) goto LAB_001f33fe;
        }
        else {
          if (local_58 != '\0') {
            in_RCX = (bool *)0x1;
            Function(parser,TransformFnc,(String *)local_b0,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_a0) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                              local_a0[0]._M_allocated_capacity + 1);
            }
            goto LAB_001f32b2;
          }
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_80,"Expected a transform function name but got an invalid name \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b0);
          puVar12 = (undefined8 *)::std::__cxx11::string::append(local_80);
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 == paVar14) {
            local_d0[0]._0_8_ = paVar14->_M_allocated_capacity;
            local_d0[0]._8_8_ = puVar12[3];
            local_e0._0_8_ = local_d0;
          }
          else {
            local_d0[0]._0_8_ = paVar14->_M_allocated_capacity;
            local_e0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar12;
          }
          local_e0._8_8_ = puVar12[1];
          *puVar12 = paVar14;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          DataParser::Error(parser,(String *)local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._0_8_ != local_d0) {
            operator_delete((void *)local_e0._0_8_,(ulong)(local_d0[0]._M_allocated_capacity + 1));
          }
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_80 + 0x10)) goto LAB_001f33fe;
        }
        operator_delete(paVar14,(ulong)(local_80._16_8_ + 1));
LAB_001f33fe:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_b0._4_4_,local_b0._0_4_) == local_a0) {
          return;
        }
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                        local_a0[0]._M_allocated_capacity + 1);
        return;
      }
      DataParser::Match(parser,'|',true);
      DataParser::Push(parser);
      Relational(parser);
      DataParser::Pop(parser,L);
      Variant::Variant((Variant *)local_b0);
      DataParser::Emit(parser,Or,(Variant *)local_b0);
LAB_001f306b:
      Variant::~Variant((Variant *)local_b0);
    }
    else if (cVar11 == '?') {
      pIVar3 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pIVar4 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Variant::Variant((Variant *)local_80);
      DataParser::Emit(parser,JumpIfZero,(Variant *)local_80);
      Variant::~Variant((Variant *)local_80);
      DataParser::Match(parser,'?',true);
      Expression(parser);
      pIVar5 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pIVar6 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Variant::Variant((Variant *)&stack0xffffffffffffffa8);
      DataParser::Emit(parser,Jump,(Variant *)&stack0xffffffffffffffa8);
      Variant::~Variant((Variant *)&stack0xffffffffffffffa8);
      DataParser::Match(parser,':',true);
      pIVar7 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pIVar8 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      Expression(parser);
      pIVar9 = (parser->program).
               super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pIVar10 = (parser->program).
                super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_b0._0_4_ = 0x5a;
      local_b0._8_8_ = 0x2d;
      pVVar2 = (Variant *)(local_b0 + 8);
      Variant::Set(pVVar2,((long)pIVar7 - (long)pIVar8 >> 4) * -0x5555555555555555);
      puVar1 = (undefined4 *)
               ((long)pIVar3 +
               ((long)(parser->program).
                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)pIVar4));
      *puVar1 = local_b0._0_4_;
      Variant::operator=((Variant *)(puVar1 + 2),pVVar2);
      Variant::~Variant(pVVar2);
      local_e0._0_4_ = 0x4a;
      local_e0._8_8_ = 0x2d;
      pVVar2 = (Variant *)(local_e0 + 8);
      Variant::Set(pVVar2,((long)pIVar10 - (long)pIVar9 >> 4) * -0x5555555555555555);
      in_RCX = (bool *)(local_e0._0_8_ & 0xffffffff);
      puVar1 = (undefined4 *)
               ((long)pIVar5 +
               ((long)(parser->program).
                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)pIVar6));
      *puVar1 = local_e0._0_4_;
      Variant::operator=((Variant *)(puVar1 + 2),pVVar2);
      Variant::~Variant(pVVar2);
    }
    else {
      if (cVar11 == '&') {
        DataParser::Match(parser,'&',false);
        DataParser::Match(parser,'&',true);
        DataParser::Push(parser);
        Relational(parser);
        DataParser::Pop(parser,L);
        Variant::Variant((Variant *)local_b0);
        DataParser::Emit(parser,And,(Variant *)local_b0);
        goto LAB_001f306b;
      }
      bVar13 = false;
    }
LAB_001f32b2:
    if (!bVar13) {
      return;
    }
  } while( true );
}

Assistant:

static void Expression(DataParser& parser)
	{
		Relational(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '&': And(parser); break;
			case '|':
			{
				parser.Match('|', false);
				if (parser.Look() == '|')
					Or(parser);
				else
				{
					parser.Push();
					parser.SkipWhitespace();
					bool valid_function_name = true;
					String name = VariableOrFunctionName(parser, &valid_function_name);
					if (name.empty())
					{
						parser.Error("Expected a transform function name but got an empty name.");
						return;
					}
					if (!valid_function_name)
					{
						parser.Error("Expected a transform function name but got an invalid name '" + name + "'.");
						return;
					}

					Function(parser, Instruction::TransformFnc, std::move(name), true);
				}
			}
			break;
			case '?': Ternary(parser); break;
			default: looping = false;
			}
		}
	}